

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

void prvTidyResetConfigToDefault(TidyDocImpl *doc)

{
  TidyOptionValue local_30;
  TidyOptionValue dflt;
  TidyOptionValue *value;
  TidyOptionImpl *option;
  TidyDocImpl *pTStack_10;
  uint ixVal;
  TidyDocImpl *doc_local;
  
  value = (TidyOptionValue *)option_defs;
  dflt.p = (char *)&doc->config;
  option._4_4_ = 0;
  pTStack_10 = doc;
  while( true ) {
    if (0x67 < option._4_4_) {
      prvTidyFreeDeclaredTags(pTStack_10,tagtype_null);
      return;
    }
    if (option._4_4_ != *(uint *)value) break;
    GetOptionDefault((TidyOptionImpl *)value,&local_30);
    CopyOptionValue(pTStack_10,(TidyOptionImpl *)value,
                    (TidyOptionValue *)(dflt.p + (ulong)option._4_4_ * 8),&local_30);
    value = value + 7;
    option._4_4_ = option._4_4_ + 1;
  }
  __assert_fail("ixVal == (uint) option->id",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/config.c"
                ,0x2bd,"void prvTidyResetConfigToDefault(TidyDocImpl *)");
}

Assistant:

void TY_(ResetConfigToDefault)( TidyDocImpl* doc )
{
    uint ixVal;
    const TidyOptionImpl* option = option_defs;
    TidyOptionValue* value = &doc->config.value[ 0 ];
    for ( ixVal=0; ixVal < N_TIDY_OPTIONS; ++option, ++ixVal )
    {
        TidyOptionValue dflt;
        assert( ixVal == (uint) option->id );
        GetOptionDefault( option, &dflt );
        CopyOptionValue( doc, option, &value[ixVal], &dflt );
    }
    TY_(FreeDeclaredTags)( doc, tagtype_null );
}